

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

VariablePtr __thiscall libcellml::Variable::equivalentVariable(Variable *this,size_t index)

{
  bool bVar1;
  bool bVar2;
  VariableImpl *pVVar3;
  vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  VariablePtr VVar5;
  weak_ptr<libcellml::Variable> *variableWeak;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
  *__range1;
  size_t count;
  size_t index_local;
  Variable *this_local;
  shared_ptr<libcellml::Variable> *variable;
  
  __range1 = (vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
              *)0x0;
  pVVar3 = pFunc((Variable *)index);
  __end1 = std::
           vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
           ::begin(&pVVar3->mEquivalentVariables);
  variableWeak = (weak_ptr<libcellml::Variable> *)
                 std::
                 vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
                 ::end(&pVVar3->mEquivalentVariables);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::weak_ptr<libcellml::Variable>_*,_std::vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>_>
                                     *)&variableWeak), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_std::weak_ptr<libcellml::Variable>_*,_std::vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>_>
    ::operator*(&__end1);
    bVar1 = false;
    std::weak_ptr<libcellml::Variable>::lock((weak_ptr<libcellml::Variable> *)this);
    bVar2 = std::operator!=((shared_ptr<libcellml::Variable> *)this,(nullptr_t)0x0);
    if (bVar2) {
      if (__range1 != in_RDX) {
        __range1 = (vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
                    *)((long)&(__range1->
                              super__Vector_base<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1);
        goto LAB_0039e83c;
      }
      bVar1 = true;
      bVar2 = true;
    }
    else {
LAB_0039e83c:
      bVar2 = false;
    }
    _Var4._M_pi = extraout_RDX;
    if (!bVar1) {
      std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)this);
      _Var4._M_pi = extraout_RDX_00;
    }
    if (bVar2) goto LAB_0039e87a;
    __gnu_cxx::
    __normal_iterator<const_std::weak_ptr<libcellml::Variable>_*,_std::vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>_>
    ::operator++(&__end1);
  }
  std::shared_ptr<libcellml::Variable>::shared_ptr
            ((shared_ptr<libcellml::Variable> *)this,(nullptr_t)0x0);
  _Var4._M_pi = extraout_RDX_01;
LAB_0039e87a:
  VVar5.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  VVar5.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (VariablePtr)VVar5.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VariablePtr Variable::equivalentVariable(size_t index) const
{
    size_t count = 0;
    for (const auto &variableWeak : pFunc()->mEquivalentVariables) {
        auto variable = variableWeak.lock();
        if (variable != nullptr) {
            if (count == index) {
                return variable;
            }
            ++count;
        }
    }

    return nullptr;
}